

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O0

void capnp::_::PointerHelpers<capnp::List<signed_char,_(capnp::Kind)0>,_(capnp::Kind)6>::set
               (PointerBuilder builder,ArrayPtr<const_signed_char> value)

{
  StructDataBitCount *this;
  size_t sVar1;
  char *pcVar2;
  char *element;
  char *__end0;
  char *__begin0;
  ArrayPtr<const_signed_char> *__range3;
  uint i;
  undefined1 local_40 [8];
  Builder l;
  ArrayPtr<const_signed_char> value_local;
  
  l.builder._32_8_ = value.ptr;
  sVar1 = kj::ArrayPtr<const_signed_char>::size
                    ((ArrayPtr<const_signed_char> *)&l.builder.structDataSize);
  init((PointerHelpers<capnp::List<signed_char,_(capnp::Kind)0>,_(capnp::Kind)6> *)local_40,
       (EVP_PKEY_CTX *)(sVar1 & 0xffffffff));
  __range3._4_4_ = 0;
  this = &l.builder.structDataSize;
  __end0 = kj::ArrayPtr<const_signed_char>::begin((ArrayPtr<const_signed_char> *)this);
  pcVar2 = kj::ArrayPtr<const_signed_char>::end((ArrayPtr<const_signed_char> *)this);
  for (; __end0 != pcVar2; __end0 = __end0 + 1) {
    List<signed_char,_(capnp::Kind)0>::Builder::set((Builder *)local_40,__range3._4_4_,*__end0);
    __range3._4_4_ = __range3._4_4_ + 1;
  }
  return;
}

Assistant:

static void set(PointerBuilder builder, kj::ArrayPtr<const ReaderFor<T>> value) {
    auto l = init(builder, value.size());
    uint i = 0;
    for (auto& element: value) {
      l.set(i++, element);
    }
  }